

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

long __thiscall
mkvparser::Track::GetNext(Track *this,BlockEntry *pCurrEntry,BlockEntry **pNextEntry)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Cluster *this_00;
  BlockEntry *pBVar4;
  long lVar5;
  
  iVar2 = (*pCurrEntry->_vptr_BlockEntry[2])(pCurrEntry);
  lVar5 = -1;
  if ((CONCAT44(extraout_var,iVar2) != 0) &&
     (*(long *)(CONCAT44(extraout_var,iVar2) + 0x10) == (this->m_info).number)) {
    this_00 = pCurrEntry->m_pCluster;
    lVar5 = Cluster::GetNext(this_00,pCurrEntry,pNextEntry);
    if (-1 < lVar5) {
      iVar2 = 0;
      do {
        while (*pNextEntry != (BlockEntry *)0x0) {
          iVar3 = (*(*pNextEntry)->_vptr_BlockEntry[2])();
          if (*(long *)(CONCAT44(extraout_var_00,iVar3) + 0x10) == (this->m_info).number) {
            return 0;
          }
          lVar5 = Cluster::GetNext(this_00,*pNextEntry,pNextEntry);
          if (lVar5 < 0) {
            return lVar5;
          }
        }
        this_00 = Segment::GetNext(this->m_pSegment,this_00);
        if (this_00 == (Cluster *)0x0) break;
        if (this_00->m_pSegment == (Segment *)0x0) {
          bVar1 = Segment::DoneParsing(this->m_pSegment);
          pBVar4 = &(this->m_eos).super_BlockEntry;
          if (!bVar1) {
            pBVar4 = (BlockEntry *)0x0;
          }
          lVar5 = (ulong)bVar1 * 4 + -3;
          goto LAB_0016444c;
        }
        lVar5 = Cluster::GetFirst(this_00,pNextEntry);
        if (lVar5 < 0) {
          return lVar5;
        }
      } while ((*pNextEntry == (BlockEntry *)0x0) || (iVar2 = iVar2 + 1, iVar2 != 100));
      pBVar4 = &(this->m_eos).super_BlockEntry;
      lVar5 = 1;
LAB_0016444c:
      *pNextEntry = pBVar4;
      return lVar5;
    }
  }
  return lVar5;
}

Assistant:

long Track::GetNext(const BlockEntry* pCurrEntry,
                    const BlockEntry*& pNextEntry) const {
  assert(pCurrEntry);
  assert(!pCurrEntry->EOS());  //?

  const Block* const pCurrBlock = pCurrEntry->GetBlock();
  assert(pCurrBlock && pCurrBlock->GetTrackNumber() == m_info.number);
  if (!pCurrBlock || pCurrBlock->GetTrackNumber() != m_info.number)
    return -1;

  const Cluster* pCluster = pCurrEntry->GetCluster();
  assert(pCluster);
  assert(!pCluster->EOS());

  long status = pCluster->GetNext(pCurrEntry, pNextEntry);

  if (status < 0)  // error
    return status;

  for (int i = 0;;) {
    while (pNextEntry) {
      const Block* const pNextBlock = pNextEntry->GetBlock();
      assert(pNextBlock);

      if (pNextBlock->GetTrackNumber() == m_info.number)
        return 0;

      pCurrEntry = pNextEntry;

      status = pCluster->GetNext(pCurrEntry, pNextEntry);

      if (status < 0)  // error
        return status;
    }

    pCluster = m_pSegment->GetNext(pCluster);

    if (pCluster == NULL) {
      pNextEntry = GetEOS();
      return 1;
    }

    if (pCluster->EOS()) {
      if (m_pSegment->DoneParsing()) {
        pNextEntry = GetEOS();
        return 1;
      }

      // TODO: there is a potential O(n^2) problem here: we tell the
      // caller to (pre)load another cluster, which he does, but then he
      // calls GetNext again, which repeats the same search.  This is
      // a pathological case, since the only way it can happen is if
      // there exists a long sequence of clusters none of which contain a
      // block from this track.  One way around this problem is for the
      // caller to be smarter when he loads another cluster: don't call
      // us back until you have a cluster that contains a block from this
      // track. (Of course, that's not cheap either, since our caller
      // would have to scan the each cluster as it's loaded, so that
      // would just push back the problem.)

      pNextEntry = NULL;
      return E_BUFFER_NOT_FULL;
    }

    status = pCluster->GetFirst(pNextEntry);

    if (status < 0)  // error
      return status;

    if (pNextEntry == NULL)  // empty cluster
      continue;

    ++i;

    if (i >= 100)
      break;
  }

  // NOTE: if we get here, it means that we didn't find a block with
  // a matching track number after lots of searching, so we give
  // up trying.

  pNextEntry = GetEOS();  // so we can return a non-NULL value
  return 1;
}